

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-xml.c
# Opt level: O1

int coda_xml_reopen_with_definition(coda_product **product,coda_product_definition *definition)

{
  coda_xml_product *product_00;
  int iVar1;
  
  if (definition == (coda_product_definition *)0x0) {
    __assert_fail("definition != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-xml.c"
                  ,0x5c,
                  "int coda_xml_reopen_with_definition(coda_product **, const coda_product_definition *)"
                 );
  }
  product_00 = (coda_xml_product *)*product;
  if (product_00->format == coda_format_xml) {
    if (definition->format == coda_format_xml) {
      coda_dynamic_type_delete(product_00->root_type);
      product_00->root_type = (coda_dynamic_type *)0x0;
      product_00->mem_size = 0;
      if (product_00->mem_ptr != (uint8_t *)0x0) {
        free(product_00->mem_ptr);
        product_00->mem_ptr = (uint8_t *)0x0;
      }
      product_00->product_definition = definition;
      iVar1 = coda_xml_parse(product_00);
      return -(uint)(iVar1 != 0);
    }
    __assert_fail("definition->format == coda_format_xml",
                  "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-xml.c"
                  ,0x5e,
                  "int coda_xml_reopen_with_definition(coda_product **, const coda_product_definition *)"
                 );
  }
  __assert_fail("product_file->format == coda_format_xml",
                "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-xml.c"
                ,0x5d,
                "int coda_xml_reopen_with_definition(coda_product **, const coda_product_definition *)"
               );
}

Assistant:

int coda_xml_reopen_with_definition(coda_product **product, const coda_product_definition *definition)
{
    coda_xml_product *product_file = *(coda_xml_product **)product;

    assert(definition != NULL);
    assert(product_file->format == coda_format_xml);
    assert(definition->format == coda_format_xml);

    coda_dynamic_type_delete(product_file->root_type);
    product_file->root_type = NULL;
    product_file->mem_size = 0;
    if (product_file->mem_ptr != NULL)
    {
        free(product_file->mem_ptr);
        product_file->mem_ptr = NULL;
    }
    product_file->product_definition = definition;

    if (coda_xml_parse(product_file) != 0)
    {
        return -1;
    }

    return 0;
}